

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.cpp
# Opt level: O1

void __thiscall CEffects::BulletTrail(CEffects *this,vec2 Pos)

{
  int iVar1;
  long in_FS_OFFSET;
  CParticle local_68;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_Add100hz == true) {
    local_68.m_Vel.field_0 = (anon_union_4_2_94730284_for_vector2_base<float>_1)0x0;
    local_68.m_Vel.field_1 = (anon_union_4_2_947302a4_for_vector2_base<float>_3)0x0;
    local_68.m_LifeSpan = 0.0;
    local_68.m_StartSize = 32.0;
    local_68.m_EndSize = 32.0;
    local_68.m_Rot = 0.0;
    local_68.m_Rotspeed = 0.0;
    local_68.m_Gravity = 0.0;
    local_68.m_Friction = 0.0;
    local_68.m_Color.field_0 = (anon_union_4_2_94730227_for_vector4_base<float>_1)0x3f800000;
    local_68.m_Color.field_1 = (anon_union_4_2_947300d3_for_vector4_base<float>_3)0x3f800000;
    local_68.m_Color.field_2 = (anon_union_4_2_94730039_for_vector4_base<float>_5)0x3f800000;
    local_68.m_Color.field_3 = (anon_union_4_2_94730017_for_vector4_base<float>_7)0x3f800000;
    local_68.m_Spr = 1;
    local_68.m_FlowAffected = 1.0;
    local_68.m_Pos = Pos;
    iVar1 = rand();
    local_68.m_LifeSpan = (float)iVar1 * 4.656613e-10 * 0.25 + 0.25;
    local_68.m_StartSize = 8.0;
    local_68.m_EndSize = 0.0;
    local_68.m_Friction = 0.7;
    CParticles::Add(((this->super_CComponent).m_pClient)->m_pParticles,0,&local_68);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CEffects::BulletTrail(vec2 Pos)
{
	if(!m_Add100hz)
		return;

	CParticle p;
	p.SetDefault();
	p.m_Spr = SPRITE_PART_BALL;
	p.m_Pos = Pos;
	p.m_LifeSpan = 0.25f + random_float()*0.25f;
	p.m_StartSize = 8.0f;
	p.m_EndSize = 0;
	p.m_Friction = 0.7f;
	m_pClient->m_pParticles->Add(CParticles::GROUP_PROJECTILE_TRAIL, &p);
}